

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapEdit.cc
# Opt level: O3

void mapDraw(vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *obstalces,Obstacle *obst,Mat *src)

{
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *pvVar1;
  undefined8 uVar2;
  pointer pvVar3;
  const_iterator __begin1;
  pointer pPVar4;
  pointer pPVar5;
  ulong uVar6;
  Point *pt;
  ulong in_stack_ffffffffffffff08;
  undefined4 local_e0 [2];
  Mat *local_d8;
  undefined8 local_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  Obstacle *local_a0;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_98;
  undefined4 local_90 [2];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_88;
  undefined8 local_80;
  ulong local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Point_<int> local_60;
  Point_<int> local_58;
  Point_<int> local_50;
  Point_<int> local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_a0 = obst;
  if ((obstalces->
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (obstalces->
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    local_98 = obstalces;
    do {
      pvVar1 = local_98;
      local_d0 = 0;
      local_e0[0] = 0x3010000;
      local_80 = 0;
      local_90[0] = 0x8104000c;
      local_c8 = 0x4054000000000000;
      uStack_c0 = 0x4054000000000000;
      local_b8 = 0x4054000000000000;
      uStack_b0 = 0;
      local_d8 = src;
      local_88 = local_98;
      uVar2 = cv::noArray();
      local_38 = 0;
      cv::drawContours(local_e0,local_90,uVar6 & 0xffffffff,&local_c8,0xffffffff,8,uVar2,0x7fffffff,
                       &local_38);
      local_d0 = 0;
      local_e0[0] = 0x3010000;
      local_80 = 0;
      local_90[0] = 0x8104000c;
      local_c8 = 0x406fe00000000000;
      uStack_b0 = 0;
      uStack_c0 = 0;
      local_b8 = 0;
      local_d8 = src;
      local_88 = pvVar1;
      in_stack_ffffffffffffff08 = cv::noArray();
      local_40 = 0;
      cv::drawContours(local_e0,local_90,uVar6 & 0xffffffff,&local_c8,3,8,in_stack_ffffffffffffff08,
                       0x7fffffff,&local_40);
      pvVar3 = (pvVar1->
               super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pPVar4 = pvVar3[uVar6].super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pPVar5 = *(pointer *)
                ((long)&pvVar3[uVar6].
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data + 8);
      local_78 = uVar6;
      if (pPVar4 != pPVar5) {
        do {
          local_d0 = 0;
          local_e0[0] = 0x3010000;
          local_48 = *pPVar4;
          local_b8 = 0;
          uStack_b0 = 0;
          local_c8 = 0;
          uStack_c0 = 0;
          in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
          local_d8 = src;
          cv::circle(local_e0,&local_48,2,&local_c8,0xffffffff,8,in_stack_ffffffffffffff08);
          pPVar4 = pPVar4 + 1;
        } while (pPVar4 != pPVar5);
        pvVar3 = (local_98->
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar6 = local_78 + 1;
    } while (uVar6 < (ulong)(((long)(local_98->
                                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3)
                            * -0x5555555555555555));
  }
  pPVar4 = (local_a0->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (local_a0->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)pPVar5 - (long)pPVar4)) {
    uVar6 = 1;
    local_78 = 0;
    uStack_70 = 0;
    uStack_6c = 0x406fe000;
    do {
      local_d0 = 0;
      local_e0[0] = 0x3010000;
      local_50 = pPVar4[uVar6 - 1];
      local_58 = pPVar4[uVar6];
      uStack_c0 = CONCAT44(uStack_6c,uStack_70);
      local_c8 = local_78;
      local_b8 = 0;
      uStack_b0 = 0;
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
      local_d8 = src;
      cv::line(local_e0,&local_50,&local_58,&local_c8,3,8,in_stack_ffffffffffffff08);
      uVar6 = uVar6 + 1;
      pPVar4 = (local_a0->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pPVar5 = (local_a0->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    } while (uVar6 < (ulong)((long)pPVar5 - (long)pPVar4 >> 3));
  }
  if (pPVar4 != pPVar5) {
    do {
      local_d0 = 0;
      local_e0[0] = 0x3010000;
      local_60 = *pPVar4;
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      in_stack_ffffffffffffff08 = in_stack_ffffffffffffff08 & 0xffffffff00000000;
      local_d8 = src;
      cv::circle(local_e0,&local_60,2,&local_c8,0xffffffff,8,in_stack_ffffffffffffff08);
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar5);
  }
  return;
}

Assistant:

void mapDraw(const std::vector<Obstacle>& obstalces, const Obstacle& obst, cv::Mat& src) {
    for (size_t i = 0; i <  obstalces.size(); i++) {
        cv::drawContours(src, obstalces, i, cv::Scalar(80, 80, 80), -1);
        cv::drawContours(src, obstalces, i, cv::Scalar(255, 0, 0), 3);
        for (const cv::Point& pt: obstalces[i]) {
            cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
        }
    }
    for (size_t i = 1; i < obst.size(); i++) {
        cv::line(src, obst[i - 1], obst[i], cv::Scalar(0, 255, 0), 3);
    }
    for (const cv::Point& pt: obst) {
        cv::circle(src, pt, 2, cv::Scalar(0, 0, 0), -1);
    }
}